

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintSExpression::TypePrinter::TypePrinter
          (TypePrinter *this,PrintSExpression *parent,
          vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *types)

{
  pointer pHVar1;
  bool bVar2;
  char cVar3;
  const_iterator cVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  size_t *psVar7;
  size_t *psVar8;
  char cVar9;
  size_t *__val;
  _Hash_node_base *p_Var10;
  pointer pHVar11;
  string_view s;
  undefined1 local_f8 [8];
  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
  usedNames;
  undefined8 uStack_a8;
  string __str;
  __node_base_ptr ap_Stack_68 [2];
  string_view local_58;
  key_type local_40;
  HeapType type;
  
  this->parent = parent;
  (this->fallback).funcCount = 0;
  (this->fallback).contCount = 0;
  (this->fallback).structCount = 0;
  (this->fallback).arrayCount = 0;
  (this->fallback).nameCache._M_h._M_buckets = &(this->fallback).nameCache._M_h._M_single_bucket;
  (this->fallback).nameCache._M_h._M_bucket_count = 1;
  (this->fallback).nameCache._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fallback).nameCache._M_h._M_element_count = 0;
  (this->fallback).nameCache._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fallback).nameCache._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fallback).nameCache._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->fallbackNames)._M_h._M_buckets = &(this->fallbackNames)._M_h._M_single_bucket;
  (this->fallbackNames)._M_h._M_bucket_count = 1;
  (this->fallbackNames)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fallbackNames)._M_h._M_element_count = 0;
  (this->fallbackNames)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fallbackNames)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fallbackNames)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  if (parent->currModule != (Module *)0x0) {
    type.id = (uintptr_t)&this->fallbackNames;
    psVar7 = &usedNames._M_h._M_rehash_policy._M_next_resize;
    usedNames._M_h._M_buckets = (__buckets_ptr)0x1;
    usedNames._M_h._M_bucket_count = 0;
    usedNames._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    usedNames._M_h._M_element_count._0_4_ = 0x3f800000;
    usedNames._M_h._M_rehash_policy._M_max_load_factor = 0.0;
    usedNames._M_h._M_rehash_policy._4_4_ = 0;
    usedNames._M_h._M_rehash_policy._M_next_resize = 0;
    p_Var10 = (parent->currModule->typeNames)._M_h._M_before_begin._M_nxt;
    local_f8 = (undefined1  [8])psVar7;
    usedNames._M_h._M_single_bucket = (__node_base_ptr)parent;
    if (p_Var10 != (_Hash_node_base *)0x0) {
      do {
        uStack_a8 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                     *)local_f8;
        std::
        _Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::
        _M_insert<wasm::Name_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<wasm::Name,true>>>>
                  ((_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)local_f8,p_Var10 + 2,&uStack_a8);
        p_Var10 = p_Var10->_M_nxt;
      } while (p_Var10 != (_Hash_node_base *)0x0);
    }
    pHVar11 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
              super__Vector_impl_data._M_start;
    pHVar1 = (types->super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pHVar11 != pHVar1) {
      __val = (size_t *)0x0;
      do {
        local_40.id = pHVar11->id;
        cVar4 = std::
                _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)(usedNames._M_h._M_single_bucket[0xd]._M_nxt + 0x32),&local_40);
        if (cVar4.super__Node_iterator_base<std::pair<const_wasm::HeapType,_wasm::TypeNames>,_true>.
            _M_cur == (__node_type *)0x0) {
          local_58 = (string_view)ZEXT816(0);
          do {
            cVar9 = '\x01';
            if (&DAT_00000009 < __val) {
              psVar7 = __val;
              cVar3 = '\x04';
              do {
                cVar9 = cVar3;
                if (psVar7 < (size_t *)0x64) {
                  cVar9 = cVar9 + -2;
                  goto LAB_00a2d418;
                }
                if (psVar7 < (size_t *)0x3e8) {
                  cVar9 = cVar9 + -1;
                  goto LAB_00a2d418;
                }
                if (psVar7 < (size_t *)0x2710) goto LAB_00a2d418;
                psVar8 = (size_t *)((ulong)psVar7 / 10000);
                bVar2 = (size_t *)0x1869f < psVar7;
                psVar7 = psVar8;
                cVar3 = cVar9 + '\x04';
              } while (bVar2);
              cVar9 = cVar9 + '\x01';
            }
LAB_00a2d418:
            uStack_a8 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                         *)&__str._M_string_length;
            std::__cxx11::string::_M_construct((ulong)&uStack_a8,cVar9);
            std::__detail::__to_chars_10_impl<unsigned_long>
                      ((char *)uStack_a8,(uint)__str._M_dataplus._M_p,(unsigned_long)__val);
            s._M_str = (char *)0x0;
            s._M_len = (size_t)uStack_a8;
            local_58 = IString::interned((IString *)__str._M_dataplus._M_p,s,SUB81(psVar7,0));
            if (uStack_a8 !=
                (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                 *)&__str._M_string_length) {
              operator_delete(uStack_a8,__str._M_string_length + 1);
            }
            sVar5 = std::
                    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    ::count((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_f8,(key_type *)&local_58);
            __val = (size_t *)((long)__val + 1);
          } while (sVar5 != 0);
          uStack_a8 = (_Hashtable<wasm::Name,wasm::Name,std::allocator<wasm::Name>,std::__detail::_Identity,std::equal_to<wasm::Name>,std::hash<wasm::Name>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                       *)local_58._M_len;
          __str._M_dataplus._M_p = local_58._M_str;
          __str._M_string_length = (size_type)ap_Stack_68;
          __str.field_2._M_allocated_capacity = 1;
          __str.field_2._8_8_ = 0;
          ap_Stack_68[0] = (__node_base_ptr)0x0;
          pmVar6 = std::__detail::
                   _Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<wasm::HeapType,_std::pair<const_wasm::HeapType,_wasm::TypeNames>,_std::allocator<std::pair<const_wasm::HeapType,_wasm::TypeNames>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)type.id,&local_40);
          *(undefined4 *)&(pmVar6->name).super_IString.str._M_len = (undefined4)uStack_a8;
          *(undefined4 *)((long)&(pmVar6->name).super_IString.str._M_len + 4) = uStack_a8._4_4_;
          *(uint *)&(pmVar6->name).super_IString.str._M_str = (uint)__str._M_dataplus._M_p;
          *(undefined4 *)((long)&(pmVar6->name).super_IString.str._M_str + 4) =
               __str._M_dataplus._M_p._4_4_;
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_M_move_assign(&(pmVar6->fieldNames)._M_h,&__str._M_string_length);
          std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_wasm::Name>,_std::allocator<std::pair<const_unsigned_int,_wasm::Name>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&__str._M_string_length);
        }
        else {
          __val = (size_t *)((long)__val + 1);
        }
        pHVar11 = pHVar11 + 1;
      } while (pHVar11 != pHVar1);
    }
    std::
    _Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<wasm::Name,_wasm::Name,_std::allocator<wasm::Name>,_std::__detail::_Identity,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_f8);
  }
  return;
}

Assistant:

TypePrinter(PrintSExpression& parent, const std::vector<HeapType>& types)
      : parent(parent) {
      if (!parent.currModule) {
        return;
      }
      std::unordered_set<Name> usedNames;
      for (auto& [_, names] : parent.currModule->typeNames) {
        usedNames.insert(names.name);
      }
      size_t i = 0;
      // Use indices for any remaining type names, skipping any that are already
      // used.
      for (auto type : types) {
        if (parent.currModule->typeNames.count(type)) {
          ++i;
          continue;
        }
        Name name;
        do {
          name = std::to_string(i++);
        } while (usedNames.count(name));
        fallbackNames[type] = {name, {}};
      }
    }